

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.h
# Opt level: O2

void __thiscall re2::SparseArray<int>::SparseArray(SparseArray<int> *this,int max_size)

{
  this->size_ = 0;
  PODArray<int>::PODArray(&this->sparse_,max_size);
  PODArray<re2::SparseArray<int>::IndexValue>::PODArray(&this->dense_,max_size);
  return;
}

Assistant:

SparseArray<Value>::SparseArray(int max_size) :
    sparse_(max_size), dense_(max_size) {
  MaybeInitializeMemory(size_, max_size);
  DebugCheckInvariants();
}